

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O1

double __thiscall libcalc::Tokenizer::evaluate(Tokenizer *this)

{
  double *pdVar1;
  char cVar2;
  Token *pTVar3;
  int iVar4;
  _Map_pointer ppdVar5;
  pointer ppTVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double *pdVar9;
  vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_> local_c0;
  double local_a8;
  double *local_a0;
  undefined1 auStack_98 [8];
  stack<double,_std::deque<double,_std::allocator<double>_>_> temp;
  double local_38;
  double a;
  
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_first = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_last = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_node = (_Map_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_finish
  ._M_cur = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_first = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_last = (_Elt_pointer)0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
  _M_map_size = 0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_start.
  _M_cur = (_Elt_pointer)0x0;
  auStack_98 = (undefined1  [8])0x0;
  temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)0x0;
  std::_Deque_base<double,_std::allocator<double>_>::_M_initialize_map
            ((_Deque_base<double,_std::allocator<double>_> *)auStack_98,0);
  toRPN(&local_c0,this);
  if (local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppTVar6 = local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pTVar3 = *ppTVar6;
      if (pTVar3->type == '\x01') {
        ppdVar5 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur) {
          ppdVar5 = (_Map_pointer)
                    ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
        }
        pdVar1 = ppdVar5[-1];
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur) {
          operator_delete(temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur);
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur =
               (_Elt_pointer)
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last[-1];
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur + 0x40;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               (_Map_pointer)
               (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur + 0x3f);
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_last =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last + -1;
        }
        else {
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + -1;
        }
        cVar2 = *(pTVar3->value)._M_dataplus._M_p;
        ppdVar5 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur) {
          ppdVar5 = (_Map_pointer)
                    ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
        }
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_finish._M_cur) {
          local_a0 = ppdVar5[-1];
          operator_delete(temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur);
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_cur =
               (_Elt_pointer)
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last[-1];
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_first =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur + 0x40;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               (_Map_pointer)
               (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur + 0x3f);
          pdVar9 = local_a0;
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_finish._M_last =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_finish._M_last + -1;
        }
        else {
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + -1;
          pdVar9 = ppdVar5[-1];
        }
        switch(cVar2) {
        case '!':
          iVar4 = factorial((int)(double)pdVar1);
          local_38 = (double)iVar4;
          break;
        case '\"':
        case '#':
        case '$':
        case '&':
        case '\'':
        case '(':
        case ')':
        case ',':
        case '.':
          break;
        case '%':
          local_38 = (double)((int)(double)pdVar9 % (int)(double)pdVar1);
          break;
        case '*':
          local_38 = (double)pdVar1 * (double)pdVar9;
          break;
        case '+':
          local_38 = (double)pdVar1 + (double)pdVar9;
          break;
        case '-':
          local_38 = (double)pdVar9 - (double)pdVar1;
          break;
        case '/':
          local_38 = (double)pdVar9 / (double)pdVar1;
          break;
        default:
          if (cVar2 == '^') {
            local_38 = (double)((int)(double)pdVar1 ^ (int)(double)pdVar9);
          }
        }
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node ==
            (_Map_pointer)
            (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + -1)) {
          std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                    ((deque<double,std::allocator<double>> *)auStack_98,&local_38);
        }
        else {
          uVar7 = SUB84(local_38,0);
          uVar8 = (undefined4)((ulong)local_38 >> 0x20);
LAB_0010332f:
          *temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
           _M_start._M_node = (double *)CONCAT44(uVar8,uVar7);
          temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
          _M_start._M_node =
               temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
               super__Deque_impl_data._M_start._M_node + 1;
        }
      }
      else {
        local_a8 = atof((pTVar3->value)._M_dataplus._M_p);
        uVar7 = SUB84(local_a8,0);
        uVar8 = (undefined4)((ulong)local_a8 >> 0x20);
        if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node !=
            (_Map_pointer)
            (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
             super__Deque_impl_data._M_finish._M_first + -1)) goto LAB_0010332f;
        std::deque<double,_std::allocator<double>_>::_M_push_back_aux<double>
                  ((deque<double,_std::allocator<double>_> *)auStack_98,&local_a8);
      }
      ppTVar6 = ppTVar6 + 1;
    } while (ppTVar6 !=
             local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ppdVar5 = temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data
            ._M_start._M_node;
  if (temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_start._M_node ==
      (_Map_pointer)
      temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.super__Deque_impl_data.
      _M_finish._M_cur) {
    ppdVar5 = (_Map_pointer)
              ((long)temp.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_last[-1] + 0x200);
  }
  pdVar1 = ppdVar5[-1];
  std::_Deque_base<double,_std::allocator<double>_>::~_Deque_base
            ((_Deque_base<double,_std::allocator<double>_> *)auStack_98);
  return (double)pdVar1;
}

Assistant:

double Tokenizer::evaluate() {
  std::stack<double> temp;
  double l, a, r;
  char o;

  for (Token *t : toRPN()) {
    if (t->type == TOKEN_TYPE.OPERATOR) {

      r = temp.top();
      temp.pop();

      o = t->value.c_str()[0];

      l = temp.top();
      temp.pop();

      switch(o) {
        case '+': a =  l + r ; break;
        case '-': a =  l - r ; break;
        case '*': a =  l * r ; break;
        case '/': a =  l / r ; break;
        case '%': a =  (int)l % (int) r ; break;
        case '^': a =  (int)l ^ (int)r ; break;
        case '!': a =  factorial(r) ; break;
      }

      temp.push(a);

    } else {
      temp.push(std::atof(t->value.c_str()));
    }
  }

  return temp.top();
}